

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::ROIAlign_x86_avx2::forward
          (ROIAlign_x86_avx2 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  Mat *this_00;
  Mat *this_01;
  _func_int **pp_Var4;
  void *pvVar5;
  int iVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int _c;
  void *pvVar13;
  long lVar14;
  _func_int *p_Var15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM5 [64];
  float fVar38;
  undefined1 in_register_00001404 [12];
  void *local_148;
  float local_108;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  Mat local_a0;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar12 = this_00->w;
  iVar10 = this_00->h;
  _c = this_00->c;
  this_01 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_01,*(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_avx2[-3]),
              *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_avx2[-3]),_c,
              this_00->elemsize,opt->blob_allocator);
  iVar21 = -100;
  if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) {
    p_Var15 = this->_vptr_ROIAlign_x86_avx2[-3];
    fVar26 = *(float *)(&this->field_0xd8 + (long)p_Var15);
    uVar1 = *this_00[1].data;
    uVar2 = *(undefined8 *)((long)this_00[1].data + 8);
    auVar31._0_4_ = fVar26 * (float)uVar1;
    auVar31._4_4_ = fVar26 * (float)((ulong)uVar1 >> 0x20);
    auVar31._8_4_ = fVar26 * 0.0;
    auVar31._12_4_ = fVar26 * 0.0;
    auVar23._0_4_ = (float)uVar2 * fVar26;
    auVar23._4_4_ = (float)((ulong)uVar2 >> 0x20) * fVar26;
    auVar23._8_4_ = fVar26 * 0.0;
    auVar23._12_4_ = fVar26 * 0.0;
    auVar23 = vsubps_avx(auVar23,auVar31);
    if ((&this->field_0xe0)[(long)p_Var15] == '\x01') {
      auVar31._0_4_ = auVar31._0_4_ + -0.5;
      auVar31._4_4_ = auVar31._4_4_ + -0.5;
      auVar31._8_4_ = auVar31._8_4_ + -0.5;
      auVar31._12_4_ = auVar31._12_4_ + -0.5;
    }
    else {
      auVar24._8_4_ = 0x3f800000;
      auVar24._0_8_ = 0x3f8000003f800000;
      auVar24._12_4_ = 0x3f800000;
      auVar23 = vmaxps_avx(auVar23,auVar24);
    }
    uVar3 = *(ulong *)(&this->field_0xd0 + (long)p_Var15);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar3;
    auVar24 = vcvtdq2ps_avx(auVar33);
    auVar33 = vrcpps_avx(auVar24);
    auVar30._0_4_ = auVar23._0_4_ * auVar33._0_4_;
    auVar30._4_4_ = auVar23._4_4_ * auVar33._4_4_;
    auVar30._8_4_ = auVar23._8_4_ * auVar33._8_4_;
    auVar30._12_4_ = auVar23._12_4_ * auVar33._12_4_;
    auVar23 = vfmsub213ps_fma(auVar24,auVar30,auVar23);
    auVar23 = vfnmadd213ps_fma(auVar23,auVar33,auVar30);
    iVar21 = (int)(uVar3 >> 0x20);
    if (*(int *)(&this->field_0xe4 + (long)p_Var15) == 1) {
      auVar24 = vmovshdup_avx(auVar23);
      if (*(int *)(&this->field_0xdc + (long)p_Var15) < 1) {
        auVar33 = vroundss_avx(auVar24,auVar24,10);
        fVar26 = auVar33._0_4_;
        auVar33 = vroundss_avx(auVar23,auVar23,10);
        fVar34 = auVar33._0_4_;
      }
      else {
        fVar26 = (float)*(int *)(&this->field_0xdc + (long)p_Var15);
        fVar34 = fVar26;
      }
      iVar6 = (int)fVar26;
      iVar9 = (int)fVar34;
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,(long)iVar21 * (long)(int)uVar3 * (long)iVar9 * (long)iVar6,
                 (allocator_type *)&local_a0);
      iVar21 = 1;
      if (1 < iVar6 * iVar9) {
        iVar21 = iVar6 * iVar9;
      }
      auVar33 = vmovshdup_avx(auVar31);
      local_108 = auVar24._0_4_;
      detectron2_pre_calc_for_bilinear_interpolate<float>
                (iVar10,iVar12,*(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_avx2[-3])
                 ,*(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_avx2[-3]),iVar6,iVar9,
                 auVar33._0_4_,auVar31._0_4_,local_108,auVar23._0_4_,iVar6,iVar9,&pre_calc);
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      if (_c < 1) {
        _c = 0;
      }
      for (iVar12 = 0; iVar12 != _c; iVar12 = iVar12 + 1) {
        Mat::channel(&local_a0,this_00,iVar12);
        pvVar5 = local_a0.data;
        Mat::~Mat(&local_a0);
        Mat::channel(&local_a0,this_01,iVar12);
        pvVar13 = local_a0.data;
        Mat::~Mat(&local_a0);
        pp_Var4 = this->_vptr_ROIAlign_x86_avx2;
        p_Var15 = pp_Var4[-3];
        iVar10 = 0;
        for (iVar11 = 0; iVar11 < *(int *)(&this->field_0xd4 + (long)p_Var15); iVar11 = iVar11 + 1)
        {
          for (lVar14 = 0; lVar14 < *(int *)(&this->field_0xd0 + (long)p_Var15); lVar14 = lVar14 + 1
              ) {
            fVar26 = 0.0;
            iVar16 = iVar10;
            for (iVar17 = 0; iVar17 != iVar6; iVar17 = iVar17 + 1) {
              pfVar7 = &pre_calc.
                        super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar16].w1;
              iVar20 = iVar9;
              while (bVar22 = iVar20 != 0, iVar20 = iVar20 + -1, bVar22) {
                auVar23 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar5 +
                                                         (long)((PreCalc<float> *)(pfVar7 + -4))->
                                                               pos1 * 4)),
                                        ZEXT416(*(uint *)((long)pvVar5 + (long)(int)pfVar7[-3] * 4))
                                        ,0x10);
                auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)((long)pvVar5 +
                                                                 (long)(int)pfVar7[-2] * 4)),0x20);
                auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)((long)pvVar5 +
                                                                 (long)(int)pfVar7[-1] * 4)),0x30);
                auVar29._0_4_ = auVar23._0_4_ * *pfVar7;
                auVar29._4_4_ = auVar23._4_4_ * pfVar7[1];
                auVar29._8_4_ = auVar23._8_4_ * pfVar7[2];
                auVar29._12_4_ = auVar23._12_4_ * pfVar7[3];
                auVar23 = vhaddps_avx(auVar29,auVar29);
                auVar23 = vhaddps_avx(auVar23,auVar23);
                fVar26 = fVar26 + auVar23._0_4_;
                pfVar7 = pfVar7 + 8;
              }
              iVar16 = iVar16 + iVar9;
            }
            iVar10 = iVar10 + iVar6 * iVar9;
            *(float *)((long)pvVar13 + lVar14 * 4) = fVar26 * (1.0 / (float)iVar21);
            p_Var15 = pp_Var4[-3];
          }
          pvVar13 = (void *)((long)pvVar13 + (long)*(int *)(&this->field_0xd0 + (long)p_Var15) * 4);
        }
      }
    }
    else {
      if (*(int *)(&this->field_0xe4 + (long)p_Var15) != 0) {
        return 0;
      }
      bVar22 = 0 < *(int *)(&this->field_0xdc + (long)p_Var15);
      auVar27._0_4_ = (float)*(int *)(&this->field_0xdc + (long)p_Var15);
      auVar24 = vroundps_avx(auVar23,10);
      auVar32[1] = bVar22;
      auVar32[0] = bVar22;
      auVar32[2] = bVar22;
      auVar32[3] = bVar22;
      auVar32[4] = bVar22;
      auVar32[5] = bVar22;
      auVar32[6] = bVar22;
      auVar32[7] = bVar22;
      auVar32[8] = bVar22;
      auVar32[9] = bVar22;
      auVar32[10] = bVar22;
      auVar32[0xb] = bVar22;
      auVar32[0xc] = bVar22;
      auVar32[0xd] = bVar22;
      auVar32[0xe] = bVar22;
      auVar32[0xf] = bVar22;
      auVar33 = vpslld_avx(auVar32,0x1f);
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = auVar27._0_4_;
      auVar27._12_4_ = auVar27._0_4_;
      auVar24 = vblendvps_avx(auVar24,auVar27,auVar33);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,
                 (long)iVar21 * (long)(int)auVar24._4_4_ *
                 (long)(int)uVar3 * (long)(int)auVar24._0_4_,(allocator_type *)&local_a0);
      p_Var15 = this->_vptr_ROIAlign_x86_avx2[-3];
      local_48 = vmovshdup_avx(auVar23);
      local_58 = vmovshdup_avx(auVar31);
      original_pre_calc_for_bilinear_interpolate<float>
                (iVar10,iVar12,*(int *)(&this->field_0xd4 + (long)p_Var15),
                 *(int *)(&this->field_0xd0 + (long)p_Var15),local_58._0_4_,auVar31._0_4_,
                 local_48._0_4_,auVar23._0_4_,*(int *)(&this->field_0xdc + (long)p_Var15),&pre_calc)
      ;
      iVar21 = 0;
      if (_c < 1) {
        _c = 0;
      }
      for (; iVar21 != _c; iVar21 = iVar21 + 1) {
        Mat::channel(&local_a0,this_00,iVar21);
        pvVar13 = local_a0.data;
        Mat::~Mat(&local_a0);
        Mat::channel(&local_a0,this_01,iVar21);
        local_148 = local_a0.data;
        Mat::~Mat(&local_a0);
        pp_Var4 = this->_vptr_ROIAlign_x86_avx2;
        p_Var15 = pp_Var4[-3];
        iVar9 = 0;
        iVar6 = 0;
        while (iVar6 < *(int *)(&this->field_0xd4 + (long)p_Var15)) {
          auVar25._0_4_ = (float)iVar6;
          auVar25._4_12_ = in_ZMM5._4_12_;
          auVar24 = vfmadd213ss_fma(auVar25,local_48,local_58);
          iVar6 = iVar6 + 1;
          auVar28._0_4_ = (float)iVar6;
          auVar28._4_12_ = in_ZMM5._4_12_;
          auVar30 = vfmadd213ss_fma(auVar28,local_48,local_58);
          auVar24 = vmaxss_avx(auVar24,ZEXT816(0) << 0x20);
          auVar33 = vminss_avx(ZEXT416((uint)(float)iVar10),auVar24);
          auVar24 = vmaxss_avx(auVar30,ZEXT816(0) << 0x20);
          auVar24 = vminss_avx(ZEXT416((uint)(float)iVar10),auVar24);
          auVar30 = ZEXT416((uint)(auVar24._0_4_ - auVar33._0_4_));
          auVar30 = vroundss_avx(auVar30,auVar30,10);
          lVar14 = 0;
          while (lVar14 < *(int *)(&this->field_0xd0 + (long)p_Var15)) {
            auVar35._0_4_ = (float)(int)lVar14;
            auVar35._4_12_ = in_register_00001404;
            auVar29 = vfmadd213ss_fma(auVar35,auVar23,auVar31);
            auVar37._0_4_ = (float)(int)(lVar14 + 1);
            auVar37._4_12_ = in_register_00001404;
            auVar32 = vfmadd213ss_fma(auVar37,auVar23,auVar31);
            fVar26 = 0.0;
            auVar29 = vmaxss_avx(auVar29,ZEXT816(0) << 0x20);
            auVar27 = vminss_avx(ZEXT416((uint)(float)iVar12),auVar29);
            auVar29 = vmaxss_avx(auVar32,ZEXT816(0) << 0x20);
            auVar29 = vminss_avx(ZEXT416((uint)(float)iVar12),auVar29);
            in_ZMM5 = ZEXT1664(auVar29);
            if (*(int *)(&this->field_0xdc + (long)p_Var15) < 1) {
              auVar32 = ZEXT416((uint)(auVar29._0_4_ - auVar27._0_4_));
              auVar32 = vroundss_avx(auVar32,auVar32,10);
              fVar38 = auVar30._0_4_;
              fVar34 = auVar32._0_4_;
            }
            else {
              fVar38 = (float)*(int *)(&this->field_0xdc + (long)p_Var15);
              fVar34 = fVar38;
            }
            iVar16 = (int)fVar38;
            iVar17 = (int)fVar34;
            iVar20 = 0;
            iVar11 = 0;
            if (0 < iVar17) {
              iVar11 = iVar17;
            }
            iVar18 = 0;
            if (0 < iVar16) {
              iVar18 = iVar16;
            }
            iVar8 = iVar9;
            for (; iVar20 != iVar18; iVar20 = iVar20 + 1) {
              pfVar7 = &pre_calc.
                        super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar8].w1;
              iVar19 = iVar11;
              while (bVar22 = iVar19 != 0, iVar19 = iVar19 + -1, bVar22) {
                auVar32 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar13 +
                                                         (long)((PreCalc<float> *)(pfVar7 + -4))->
                                                               pos1 * 4)),
                                        ZEXT416(*(uint *)((long)pvVar13 + (long)(int)pfVar7[-3] * 4)
                                               ),0x10);
                auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)((long)pvVar13 +
                                                                 (long)(int)pfVar7[-2] * 4)),0x20);
                auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)((long)pvVar13 +
                                                                 (long)(int)pfVar7[-1] * 4)),0x30);
                auVar36._0_4_ = auVar32._0_4_ * *pfVar7;
                auVar36._4_4_ = auVar32._4_4_ * pfVar7[1];
                auVar36._8_4_ = auVar32._8_4_ * pfVar7[2];
                auVar36._12_4_ = auVar32._12_4_ * pfVar7[3];
                auVar32 = vhaddps_avx(auVar36,auVar36);
                auVar32 = vhaddps_avx(auVar32,auVar32);
                fVar26 = fVar26 + auVar32._0_4_;
                pfVar7 = pfVar7 + 8;
              }
              iVar8 = iVar8 + iVar11;
            }
            fVar34 = 0.0;
            if (auVar33._0_4_ < auVar24._0_4_ && auVar27._0_4_ < auVar29._0_4_) {
              fVar34 = fVar26 / (float)(iVar17 * iVar16);
            }
            iVar9 = iVar9 + iVar18 * iVar11;
            *(float *)((long)local_148 + lVar14 * 4) = fVar34;
            lVar14 = lVar14 + 1;
            p_Var15 = pp_Var4[-3];
          }
          local_148 = (void *)((long)local_148 +
                              (long)*(int *)(&this->field_0xd0 + (long)p_Var15) * 4);
        }
      }
    }
    std::_Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::~_Vector_base
              (&pre_calc.
                super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>);
    iVar21 = 0;
  }
  return iVar21;
}

Assistant:

int ROIAlign_x86_avx2::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}